

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

int __thiscall mp::internal::TextReader<fmt::Locale>::ReadInt<int>(TextReader<fmt::Locale> *this)

{
  bool bVar1;
  int value;
  int local_c;
  
  local_c = 0;
  bVar1 = DoReadOptionalInt<int>(this,&local_c);
  if (!bVar1) {
    ReportError<>(this,(CStringRef)0x15c225);
  }
  return local_c;
}

Assistant:

Int ReadInt() {
    Int value = 0;
    if (!DoReadOptionalInt(value))
      ReportError("expected integer");
    return value;
  }